

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

string * cs_impl::string_cs_ext::cut(string *str,numeric *n)

{
  ulong uVar1;
  numeric *in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_t i;
  undefined8 local_20;
  
  local_20 = 0;
  while( true ) {
    uVar1 = cs::numeric::as_integer(in_RDX);
    if (uVar1 <= local_20) break;
    std::__cxx11::string::pop_back();
    local_20 = local_20 + 1;
  }
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

string cut(string &str, const numeric& n)
		{
			for (std::size_t i = 0; i < n.as_integer(); ++i)
				str.pop_back();
			return str;
		}